

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O1

void __thiscall cali::Caliper::activate_channel(Caliper *this,Channel *channel)

{
  GlobalData *pGVar1;
  __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
  _Var2;
  ulong uVar3;
  
  ((channel->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  is_active = true;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<cali::Channel*,std::vector<cali::Channel,std::allocator<cali::Channel>>>,__gnu_cxx::__ops::_Iter_equals_val<cali::Channel_const>>
                    ((this->sG->active_channels).
                     super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->sG->active_channels).
                     super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
                     super__Vector_impl_data._M_finish,channel);
  if (_Var2._M_current ==
      (this->sG->active_channels).super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<cali::Channel,std::allocator<cali::Channel>>::emplace_back<cali::Channel&>
              ((vector<cali::Channel,std::allocator<cali::Channel>> *)&this->sG->active_channels,
               channel);
  }
  pGVar1 = this->sG;
  uVar3 = (long)(pGVar1->active_channels).
                super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pGVar1->active_channels).
                super__Vector_base<cali::Channel,_std::allocator<cali::Channel>_>._M_impl.
                super__Vector_impl_data._M_start >> 4;
  if (uVar3 < pGVar1->max_active_channels) {
    uVar3 = pGVar1->max_active_channels;
  }
  pGVar1->max_active_channels = uVar3;
  return;
}

Assistant:

void Caliper::activate_channel(Channel& channel)
{
    channel.mP->is_active = true;

    auto it = std::find(sG->active_channels.begin(), sG->active_channels.end(), channel);
    if (it == sG->active_channels.end())
        sG->active_channels.emplace_back(channel);

    sG->max_active_channels = std::max(sG->max_active_channels, sG->active_channels.size());
}